

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# presagearchive.c
# Opt level: O2

PresageArchive * PresageArchive_NewFromFiles(char *path1,char *path2,LPStatus *status)

{
  uint16_t internal_id_00;
  PresageArchiveKind PVar1;
  uint32_t uVar2;
  PresageArchive *archive;
  PRDPRS *pPVar3;
  PresageArchiveMember **ppPVar4;
  PresageArchiveMember *member;
  long lVar5;
  ulong uVar6;
  int i;
  FILE *unaff_R12;
  FILE *__stream;
  uint16_t *dest;
  uint16_t internal_id;
  uint16_t actual_n_entries;
  uint8_t magic;
  uint32_t size;
  uint32_t rid;
  uint32_t offset;
  LPStatus new_archive_status;
  LPStatus *local_60;
  PresageArchive *local_58;
  PresageArchiveMemberFiletype filetype;
  LPStatus new_member_status;
  
  archive = (PresageArchive *)calloc(1,0x20);
  if (archive == (PresageArchive *)0x0) {
    *status = LUNAPURPURA_ERROR;
LAB_0010273d:
    PresageArchive_Close(archive);
    return (PresageArchive *)0x0;
  }
  archive->kind = (uint)(path2 == (char *)0x0 || path1 == (char *)0x0);
  if (path2 == (char *)0x0 || path1 == (char *)0x0) {
    pPVar3 = (PRDPRS *)PRX_New(path1,&new_archive_status);
  }
  else {
    unaff_R12 = (FILE *)&new_archive_status;
    pPVar3 = PRDPRS_New(path1,path2,(LPStatus *)unaff_R12);
  }
  if (new_archive_status != LUNAPURPURA_OK) {
    *status = new_archive_status;
    goto LAB_0010273d;
  }
  (archive->archive).prdprs = pPVar3;
  if (archive->kind < 2) {
    unaff_R12 = (FILE *)pPVar3->header_fp;
  }
  ReadUint8((FILE *)unaff_R12,1,&magic);
  if (magic != '\x01') {
    *status = LUNAPURPURA_BADMAGIC;
    goto LAB_0010273d;
  }
  local_60 = status;
  fseek(unaff_R12,0x89,1);
  ReadUint16LE((FILE *)unaff_R12,1,&actual_n_entries);
  dest = &archive->n_entries;
  ReadUint16LE((FILE *)unaff_R12,1,dest);
  fseek(unaff_R12,2,1);
  ppPVar4 = (PresageArchiveMember **)calloc((ulong)archive->n_entries,0x30);
  archive->members = ppPVar4;
  fseek(unaff_R12,0x18,1);
  local_58 = archive;
  for (uVar6 = 0; archive = local_58, uVar6 < *dest; uVar6 = uVar6 + 1) {
    member = PresageArchiveMember_New(&new_member_status);
    if (new_member_status != LUNAPURPURA_OK) {
      *local_60 = new_member_status;
      goto LAB_0010273d;
    }
    ReadUint16LE((FILE *)unaff_R12,1,&internal_id);
    internal_id_00 = internal_id;
    if (internal_id == 0) {
      internal_id_00 = (short)*(undefined4 *)dest + 1;
    }
    PresageArchiveMember_SetInternalId(member,internal_id_00);
    fseek(unaff_R12,6,1);
    ReadUint32LE((FILE *)unaff_R12,1,&offset);
    PresageArchiveMember_SetOffset(member,offset);
    ReadChar((FILE *)unaff_R12,4,filetype);
    PresageArchiveMember_SetFiletype(member,filetype);
    ReadUint32LE((FILE *)unaff_R12,1,&rid);
    PresageArchiveMember_SetResourceId(member,rid);
    ReadUint32LE((FILE *)unaff_R12,1,&size);
    PresageArchiveMember_SetSize(member,size);
    local_58->members[uVar6] = member;
  }
  fseek(unaff_R12,((ulong)actual_n_entries - (ulong)*dest) * 0x18,1);
  PVar1 = archive->kind;
  if (PVar1 == PRESAGE_ARCHIVE_KIND_PRX) {
    lVar5 = ftell(unaff_R12);
    archive->data_offset_start = (uint32_t)lVar5;
    PVar1 = archive->kind;
  }
  if (PVar1 == PRESAGE_ARCHIVE_KIND_PRX) {
    pPVar3 = (archive->archive).prdprs;
  }
  else {
    if (PVar1 != PRESAGE_ARCHIVE_KIND_PRDPRS) {
      __stream = (FILE *)0x0;
      goto LAB_00102765;
    }
    pPVar3 = (PRDPRS *)&((archive->archive).prdprs)->data_fp;
  }
  __stream = (FILE *)pPVar3->header_fp;
LAB_00102765:
  for (uVar6 = 0; uVar6 < *dest; uVar6 = uVar6 + 1) {
    uVar2 = PresageArchive_AbsoluteOffsetForMemberAtIndex(archive,(int)uVar6);
    fseek(__stream,(ulong)uVar2,0);
    fseek(__stream,(ulong)(archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) | 0xffffffffffffffea,1);
    ReadChar((FILE *)__stream,0x10,(char *)&new_member_status);
    PresageArchiveMember_SetName(archive->members[uVar6],(char *)&new_member_status);
  }
  *local_60 = LUNAPURPURA_OK;
  return archive;
}

Assistant:

PresageArchive *
PresageArchive_NewFromFiles(const char *path1, const char *path2, LPStatus *status)
{
	PresageArchive *archive = calloc(1, sizeof(PresageArchive));

	if (!archive) {
		*status = LUNAPURPURA_ERROR;
		goto fail;
	}

	if (path1 && path2) {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRDPRS;
	} else {
		archive->kind = PRESAGE_ARCHIVE_KIND_PRX;
	}

	LPStatus new_archive_status;

	switch (archive->kind) {
	case PRESAGE_ARCHIVE_KIND_PRDPRS:
		{
			PRDPRS *prdprs = PRDPRS_New(path1, path2, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prdprs = prdprs;
		}
		break;
	case PRESAGE_ARCHIVE_KIND_PRX:
		{
			PRX *prx = PRX_New(path1, &new_archive_status);
			if (new_archive_status != LUNAPURPURA_OK) {
				*status = new_archive_status;
				goto fail;
			}
			archive->archive.prx = prx;
		}
		break;
	}

	/*
	 * At this stage in the process, we are only concerned about the members'
	 * metadata, so, obtain the appropriate file pointer for that task.
	 */
	FILE *fp;
	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: fp = archive->archive.prdprs->header_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: fp = archive->archive.prx->fp; break;
	}

	uint8_t magic;
	ReadUint8(fp, 1, &magic);
	if (magic != PRX_MAGIC) {
		*status = LUNAPURPURA_BADMAGIC;
		goto fail;
	}

	/* 128 + 10 - 1, I guess -- all zeroes */
	fseek(fp, 137L, SEEK_CUR);

	/*
	 * This is the number of entries _including_ dummy ones, which may be
	 * present at the start and/or end of the archive's table of contents.
	 */
	uint16_t actual_n_entries;
	ReadUint16LE(fp, 1, &actual_n_entries);

	/* This is the real count of entries we ultimately care about. */
	ReadUint16LE(fp, 1, &archive->n_entries);

	fseek(fp, 2L, SEEK_CUR); /* Ignore */

	archive->members = calloc(archive->n_entries, sizeof(PresageArchiveMember));

	/*
	 * Purposefully skip over the zeroeth entry (which has internal_id of 1),
	 * it's always a "dummy" entry which serves little purpose.
	 */
	fseek(fp, 24L, SEEK_CUR);

	/*
	 * OK now we *finally* can access the individual archive members.
	 */
	for (int i = 0; i < archive->n_entries; i++) {
		LPStatus new_member_status;
		PresageArchiveMember *member = PresageArchiveMember_New(&new_member_status);

		if (new_member_status != LUNAPURPURA_OK) {
			*status = new_member_status;
			goto fail;
		}

		/*
		 * The last internal_id is always stored as '0' rather than what you'd
		 * expect. Anthony Kozar suspects this is to merely signify the end of the
		 * list, since we already know how many members there are by now.
		 */
		uint16_t internal_id;
		ReadUint16LE(fp, 1, &internal_id);
		if (internal_id == 0) {
			PresageArchiveMember_SetInternalId(member, archive->n_entries+1);
		} else {
			PresageArchiveMember_SetInternalId(member, internal_id);
		}

		fseek(fp, 6L, SEEK_CUR);

		uint32_t offset;
		ReadUint32LE(fp, 1, &offset);
		PresageArchiveMember_SetOffset(member, offset);

		PresageArchiveMemberFiletype filetype;
		ReadChar(fp, sizeof(PresageArchiveMemberFiletype), filetype);
		PresageArchiveMember_SetFiletype(member, filetype);

		uint32_t rid;
		ReadUint32LE(fp, 1, &rid);
		PresageArchiveMember_SetResourceId(member, rid);

		uint32_t size;
		ReadUint32LE(fp, 1, &size);
		PresageArchiveMember_SetSize(member, size);

		archive->members[i] = member;
	}

	/*
	 * Account for the dummy entries at the end of the table of contents, if
	 * necessary.
	 */
	fseek(fp, 24L*(actual_n_entries - archive->n_entries), SEEK_CUR);

	/*
	 * In PRXes, the "offset" field for each member does NOT indicate an absolute
	 * offset. It's actually an offset from the position of the file we're
	 * currently at right now. So let's keep track of it.
	 */
	if (archive->kind == PRESAGE_ARCHIVE_KIND_PRX) {
		archive->data_offset_start = ftell(fp);
	}

	/*
	 * OK now let's figure out the individual member names. We start with the
	 * 1st member (not the 0th member) because remember we actually can't
	 * obtain information about the "dummy" entry at the beginning.
	 *
	 * Also, the offset brings us to the start of the data, but that skips
	 * past the filename!  So that's why we rewind a little.
	 *
	 * This is a little tricky because, in PRD/PRS pairs, the member names are
	 * NOT stored in the header. So we have to bring the other file pointer into
	 * the picture now.
	 */
	FILE *name_finder_fp = NULL;

	switch (archive->kind) {
		case PRESAGE_ARCHIVE_KIND_PRDPRS: name_finder_fp = archive->archive.prdprs->data_fp; break;
		case PRESAGE_ARCHIVE_KIND_PRX: name_finder_fp = archive->archive.prx->fp; break;
	}

	for (int i = 0; i < archive->n_entries; i++) {
		uint32_t abs_offset = PresageArchive_AbsoluteOffsetForMemberAtIndex(archive, i);
		fseek(name_finder_fp, abs_offset, SEEK_SET);

		/* 
		 * Rewind to get the filename. Purposefully avoid an extra underscore in
		 * PRD/PRS members.
		 */
		long rewind_amt = PRESAGEARCHIVEMEMBER_NAME_LEN;
		rewind_amt += (archive->kind == PRESAGE_ARCHIVE_KIND_PRDPRS) ? 5 : 6;
		fseek(name_finder_fp, -rewind_amt, SEEK_CUR); 

		PresageArchiveMemberName name;
		ReadChar(name_finder_fp, sizeof(PresageArchiveMemberName), name);
		PresageArchiveMember_SetName(archive->members[i], name);
	}

	*status = LUNAPURPURA_OK;
	return archive;

fail:
	PresageArchive_Close(archive);
	return NULL;
}